

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

void calcBias<Blob<224>,unsigned_int>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  code *in_RDI;
  byte in_R8B;
  int bitB;
  int bitA;
  int iOut;
  int iBit;
  int *cursor;
  int irep;
  uint B;
  uint A;
  Blob<224> K;
  int hashbits;
  int keybits;
  int hashbytes;
  int keybytes;
  uint32_t local_70;
  uint32_t in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined1 local_58 [4];
  undefined1 local_54 [4];
  Blob<224> local_50;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  int local_14;
  vector<int,_std::allocator<int>_> *local_10;
  code *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0x1c;
  local_2c = 4;
  local_30 = 0xe0;
  local_34 = 0x20;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Blob<224>::Blob(&local_50);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    if (((local_21 & 1) != 0) && (iVar3 % (local_14 / 10) == 0)) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94);
    (*local_8)(&local_50,0x1c,0,local_54);
    in_stack_ffffffffffffff98 = std::vector<int,_std::allocator<int>_>::operator[](local_10,0);
    for (in_stack_ffffffffffffff94 = 0; (int)in_stack_ffffffffffffff94 < 0xe0;
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      flipbit(&local_50,0x1c,in_stack_ffffffffffffff94);
      (*local_8)(&local_50,0x1c,0,local_58);
      flipbit(&local_50,0x1c,in_stack_ffffffffffffff94);
      for (local_70 = 0; (int)local_70 < 0x20; local_70 = local_70 + 1) {
        uVar1 = getbit(local_54,4,local_70);
        uVar2 = getbit(local_58,4,local_70);
        *in_stack_ffffffffffffff98 = (uVar1 ^ uVar2) + *in_stack_ffffffffffffff98;
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1;
      }
    }
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}